

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O0

int png_check_fp_string(png_const_charp string,png_size_t size)

{
  int iVar1;
  png_size_t local_30;
  png_size_t char_index;
  png_size_t pStack_20;
  int state;
  png_size_t size_local;
  png_const_charp string_local;
  
  char_index._4_4_ = 0;
  local_30 = 0;
  pStack_20 = size;
  size_local = (png_size_t)string;
  iVar1 = png_check_fp_number(string,size,(int *)((long)&char_index + 4),&local_30);
  if ((iVar1 == 0) || ((local_30 != pStack_20 && (*(char *)(size_local + local_30) != '\0')))) {
    string_local._4_4_ = 0;
  }
  else {
    string_local._4_4_ = char_index._4_4_;
  }
  return string_local._4_4_;
}

Assistant:

int
png_check_fp_string(png_const_charp string, png_size_t size)
{
   int        state=0;
   png_size_t char_index=0;

   if (png_check_fp_number(string, size, &state, &char_index) != 0 &&
      (char_index == size || string[char_index] == 0))
      return state /* must be non-zero - see above */;

   return 0; /* i.e. fail */
}